

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::Observed2CIRS
              (double az,double zen,double *ra,double *dec,double julian_date,double longitude,
              double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
              double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar2;
  double dVar3;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_stack_00000010;
  int err_code;
  CEDate date;
  undefined8 in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  CEDate *in_stack_ffffffffffffff20;
  CEDate local_90;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_40 = in_XMM5_Qa;
  local_38 = in_XMM4_Qa;
  local_30 = in_XMM3_Qa;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  CEDate::CEDate(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (CEDateType)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  dVar2 = CEDate::GetMJD2JDFactor();
  dVar3 = CEDate::MJD(&local_90);
  iVar1 = iauAtoi13(local_8,local_10,dVar2,dVar3,in_stack_00000010,local_30,local_38,local_40,"A",
                    local_18,local_20);
  CEDate::~CEDate((CEDate *)0x14c6ad);
  return iVar1;
}

Assistant:

int CECoordinates::Observed2CIRS(double az, double zen,
                                 double *ra, double *dec,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um)
{
    CEDate date(julian_date, CEDateType::JD);
    int err_code = iauAtoi13("A", az, zen,
                             CEDate::GetMJD2JDFactor(), date.MJD(),
                             dut1,
                             longitude, latitude,
                             elevation_m,
                             xp, yp,
                             pressure_hPa,
                             temperature_celsius,
                             relative_humidity,
                             wavelength_um,
                             ra, dec) ;
    return err_code ;
}